

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# peer_connection.cpp
# Opt level: O1

int __thiscall libtorrent::aux::peer_connection::timeout(peer_connection *this)

{
  session_settings *psVar1;
  int iVar2;
  unique_lock<std::mutex> local_28;
  
  psVar1 = (this->super_peer_connection_hot_members).m_settings;
  local_28._M_device = &psVar1->m_mutex;
  local_28._M_owns = false;
  ::std::unique_lock<std::mutex>::lock(&local_28);
  local_28._M_owns = true;
  iVar2 = (psVar1->m_store).m_ints._M_elems[10];
  ::std::unique_lock<std::mutex>::~unique_lock(&local_28);
  if (this->m_peer_info != (torrent_peer *)0x0) {
    iVar2 = iVar2 << (this->m_peer_info->field_0x1e & 2);
  }
  return iVar2;
}

Assistant:

int peer_connection::timeout() const
	{
		TORRENT_ASSERT(is_single_thread());
		int ret = m_settings.get_int(settings_pack::peer_timeout);
#if TORRENT_USE_I2P
		if (m_peer_info && m_peer_info->is_i2p_addr)
		{
			// quadruple the timeout for i2p peers
			ret *= 4;
		}
#endif
		return ret;
	}